

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O3

apx_portConnectorChangeTable_t *
apx_nodeInstance_get_provide_port_connector_changes(apx_nodeInstance_t *self,_Bool auto_create)

{
  apx_portConnectorChangeTable_t *paVar1;
  
  if (self == (apx_nodeInstance_t *)0x0) {
    return (apx_portConnectorChangeTable_t *)0x0;
  }
  if (self->num_provide_ports != 0) {
    if (!auto_create || self->provide_port_changes != (apx_portConnectorChangeTable_t *)0x0) {
      return self->provide_port_changes;
    }
    paVar1 = apx_portConnectorChangeTable_new(self->num_provide_ports);
    self->provide_port_changes = paVar1;
    if (paVar1 != (apx_portConnectorChangeTable_t *)0x0) {
      if (self->server == (apx_server_t *)0x0) {
        return paVar1;
      }
      apx_server_insert_modified_node_instance(self->server,self);
      return self->provide_port_changes;
    }
  }
  return (apx_portConnectorChangeTable_t *)0x0;
}

Assistant:

apx_portConnectorChangeTable_t* apx_nodeInstance_get_provide_port_connector_changes(apx_nodeInstance_t* self, bool auto_create)
{
   if ((self != NULL) && (self->num_provide_ports > 0))
   {
      if ((self->provide_port_changes == NULL) && (auto_create))
      {
         self->provide_port_changes = apx_portConnectorChangeTable_new(self->num_provide_ports);
         if ((self->provide_port_changes != NULL) && (self->server != NULL))
         {
            apx_server_insert_modified_node_instance(self->server, self);
         }
      }
      return self->provide_port_changes;
   }
   return (apx_portConnectorChangeTable_t*)NULL;
}